

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBreak * ParseBreak(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  SynNumber *number;
  Lexeme *end;
  SynNumber *node;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_break);
  if (bVar1) {
    number = ParseNumber(ctx);
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,lex_semicolon,"ERROR: break statement must be followed by \';\' or a constant");
    ctx_local = (ParseContext *)ParseContext::get<SynBreak>(ctx);
    end = ParseContext::Previous(ctx);
    SynBreak::SynBreak((SynBreak *)ctx_local,begin,end,number);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynBreak *)ctx_local;
}

Assistant:

SynBreak* ParseBreak(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_break))
	{
		// Optional
		SynNumber *node = ParseNumber(ctx);

		CheckConsume(ctx, lex_semicolon, "ERROR: break statement must be followed by ';' or a constant");

		return new (ctx.get<SynBreak>()) SynBreak(start, ctx.Previous(), node);
	}

	return NULL;
}